

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool write_output_file(char *output,string *output_file)

{
  bool bVar1;
  ofstream *poVar2;
  string msg;
  ofstream f;
  int aiStack_200 [120];
  
  std::ofstream::ofstream(&f);
  if (output_file->_M_string_length == 0) {
    poVar2 = (ofstream *)&std::cout;
LAB_0015c497:
    std::operator<<((ostream *)poVar2,output);
    if (output_file->_M_string_length == 0) {
      bVar1 = true;
      std::ostream::flush();
      goto LAB_0015c502;
    }
    std::ofstream::close();
    bVar1 = true;
    if (*(int *)((long)aiStack_200 + *(long *)(_f + -0x18)) == 0) goto LAB_0015c502;
    std::operator+(&msg,"Writing to output file: ",output_file);
  }
  else {
    poVar2 = &f;
    std::ofstream::open((char *)poVar2,(_Ios_Openmode)(output_file->_M_dataplus)._M_p);
    if (*(int *)((long)aiStack_200 + *(long *)(_f + -0x18)) == 0) goto LAB_0015c497;
    std::operator+(&msg,"Writing to output file: ",output_file);
  }
  perror(msg._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&msg);
  bVar1 = false;
LAB_0015c502:
  std::ofstream::~ofstream(&f);
  return bVar1;
}

Assistant:

bool write_output_file(const char *output, const std::string &output_file)
{
    std::ostream *o;
    std::ofstream f;

    if (output_file.empty()) {
        o = &std::cout;
    } else {
        f.open(output_file.c_str());
        if (!f.good()) {
            std::string msg = "Writing to output file: " + output_file;
            perror(msg.c_str());
            return false;
        }
        o = &f;
    }

    (*o) << output;

    if (output_file.empty()) {
        std::cout.flush();
    } else {
        f.close();
        if (!f.good()) {
            std::string msg = "Writing to output file: " + output_file;
            perror(msg.c_str());
            return false;
        }
    }
    return true;
}